

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merlin.cpp
# Opt level: O0

bool __thiscall Merlin::read_dataset(Merlin *this,string *dataset)

{
  double dVar1;
  byte bVar2;
  int iVar3;
  runtime_error *this_00;
  size_type sVar4;
  reference pvVar5;
  ulong uVar6;
  long lVar7;
  double dVar8;
  char *pcVar9;
  char cVar10;
  runtime_error *e;
  int local_33c;
  int val;
  double local_310;
  double d;
  size_t k;
  vector<double,_std::allocator<double>_> likelihood;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  temp;
  string str;
  size_t last;
  size_t first;
  string local_278 [8];
  string token;
  ulong local_258;
  size_t i;
  vector<merlin::observation,_std::allocator<merlin::observation>_> example;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string local_218 [8];
  string line;
  ulong local_1f8;
  size_t l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string local_1d0 [8];
  string err_msg;
  istringstream local_1a0 [8];
  istringstream in;
  string *dataset_local;
  Merlin *this_local;
  
  std::__cxx11::istringstream::istringstream(local_1a0,(string *)dataset,_S_in);
  bVar2 = std::ios::fail();
  if ((bVar2 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1d0,"Cannot open the training dataset string",
               (allocator *)
               ((long)&lines.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&lines.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,local_1d0);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  vector<std::vector<merlin::observation,_std::allocator<merlin::observation>_>,_std::allocator<std::vector<merlin::observation,_std::allocator<merlin::observation>_>_>_>
  ::clear(&this->m_dataset);
  merlin::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&l,dataset,'|');
  for (local_1f8 = 0;
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&l), local_1f8 < sVar4; local_1f8 = local_1f8 + 1) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&l,local_1f8);
    std::__cxx11::string::string(local_218,(string *)pvVar5);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      merlin::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&example.
                        super__Vector_base<merlin::observation,_std::allocator<merlin::observation>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_218,',');
      std::vector<merlin::observation,_std::allocator<merlin::observation>_>::vector
                ((vector<merlin::observation,_std::allocator<merlin::observation>_> *)&i);
      for (local_258 = 0;
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&example.
                             super__Vector_base<merlin::observation,_std::allocator<merlin::observation>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage), local_258 < sVar4;
          local_258 = local_258 + 1) {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&example.
                                  super__Vector_base<merlin::observation,_std::allocator<merlin::observation>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,local_258);
        std::__cxx11::string::string(local_278,(string *)pvVar5);
        iVar3 = std::__cxx11::string::compare((char *)local_278);
        if (iVar3 == 0) {
          merlin::observation::observation((observation *)&first,(int)local_258);
          std::vector<merlin::observation,_std::allocator<merlin::observation>_>::push_back
                    ((vector<merlin::observation,_std::allocator<merlin::observation>_> *)&i,
                     (value_type *)&first);
          merlin::observation::~observation((observation *)&first);
        }
        else {
          lVar7 = std::__cxx11::string::find((char *)local_278,0x256286);
          if (lVar7 == -1) {
            pcVar9 = (char *)std::__cxx11::string::c_str();
            local_33c = atoi(pcVar9);
            merlin::observation::observation((observation *)&e,(int)local_258,local_33c);
            std::vector<merlin::observation,_std::allocator<merlin::observation>_>::push_back
                      ((vector<merlin::observation,_std::allocator<merlin::observation>_> *)&i,
                       (value_type *)&e);
            merlin::observation::~observation((observation *)&e);
          }
          else {
            cVar10 = (char)local_278;
            std::__cxx11::string::find(cVar10,0x5b);
            std::__cxx11::string::find(cVar10,0x5d);
            std::__cxx11::string::substr
                      ((ulong)&temp.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_278);
            merlin::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&likelihood.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage,
                          (string *)
                          &temp.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,';');
            std::vector<double,_std::allocator<double>_>::vector
                      ((vector<double,_std::allocator<double>_> *)&k);
            for (d = 0.0; dVar1 = d,
                dVar8 = (double)std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)&likelihood.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage),
                (ulong)dVar1 < (ulong)dVar8; d = (double)((long)d + 1)) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&likelihood.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)d);
              pcVar9 = (char *)std::__cxx11::string::c_str();
              local_310 = atof(pcVar9);
              std::vector<double,_std::allocator<double>_>::push_back
                        ((vector<double,_std::allocator<double>_> *)&k,&local_310);
            }
            merlin::observation::observation
                      ((observation *)&stack0xfffffffffffffcc8,(int)local_258,
                       (vector<double,_std::allocator<double>_> *)&k);
            std::vector<merlin::observation,_std::allocator<merlin::observation>_>::push_back
                      ((vector<merlin::observation,_std::allocator<merlin::observation>_> *)&i,
                       (value_type *)&stack0xfffffffffffffcc8);
            merlin::observation::~observation((observation *)&stack0xfffffffffffffcc8);
            std::vector<double,_std::allocator<double>_>::~vector
                      ((vector<double,_std::allocator<double>_> *)&k);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&likelihood.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::~string
                      ((string *)
                       &temp.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
        }
        std::__cxx11::string::~string(local_278);
      }
      std::
      vector<std::vector<merlin::observation,_std::allocator<merlin::observation>_>,_std::allocator<std::vector<merlin::observation,_std::allocator<merlin::observation>_>_>_>
      ::push_back(&this->m_dataset,(value_type *)&i);
      std::vector<merlin::observation,_std::allocator<merlin::observation>_>::~vector
                ((vector<merlin::observation,_std::allocator<merlin::observation>_> *)&i);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&example.
                    super__Vector_base<merlin::observation,_std::allocator<merlin::observation>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::__cxx11::string::~string(local_218);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&l);
  std::__cxx11::istringstream::~istringstream(local_1a0);
  return true;
}

Assistant:

bool Merlin::read_dataset(std::string dataset) {
	try {

		// Open the evidence file
		std::istringstream in(dataset);
		if (in.fail()) {
			std::string err_msg("Cannot open the training dataset string");
			throw std::runtime_error(err_msg);
		}

		// Clear any previous training dataset
		m_dataset.clear();

		// Read the training dataset string line by line
		std::vector<std::string> lines = merlin::split(dataset, '|');
		for (size_t l = 0; l < lines.size(); ++l) {
			std::string line = lines[l];
			if (line.empty()) continue; // skip empty lines
			std::vector<std::string> tokens = merlin::split(line, ',');
			std::vector<merlin::observation> example;
			for (size_t i = 0; i < tokens.size(); ++i) {
				std::string token = tokens[i];
				if (token.compare("?") == 0) { // missing value
					example.push_back(merlin::observation(i));
				} else if (token.find("[") != token.npos) { // likelihood evidence
					size_t first = token.find('[');
					size_t last = token.find(']');
					std::string str = token.substr(first+1, last-first-1);
					std::vector<std::string> temp = merlin::split(str, ';');
					std::vector<double> likelihood;
					for (size_t k = 0; k < temp.size(); ++k) {
						double d = std::atof(temp[k].c_str());
						likelihood.push_back(d);
					}
					example.push_back(merlin::observation(i, likelihood));
				} else { // regular value
					int val = std::atoi(token.c_str());
					example.push_back(merlin::observation(i, val));
				}
			}

			m_dataset.push_back(example);
		}

		return true;
	} catch (const std::runtime_error& e) {
		std::cerr << e.what() << std::endl;
		return false;
	}
}